

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void add_intrinsic_4f_s3_4f(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *ret;
  MOJOSHADER_astDataType *f4;
  char *fn_local;
  Context_conflict *ctx_local;
  
  ret = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,fn,ret,&ctx->dt_sampler3d,ret);
  return;
}

Assistant:

static void add_intrinsic_4f_s3_4f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    add_intrinsic2(ctx, fn, f4, &ctx->dt_sampler3d, f4);
}